

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  ostream *poVar4;
  char *message;
  ulong uVar5;
  size_t cpuCount;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  double local_48;
  double local_40;
  int local_34;
  double dStack_30;
  int i;
  double interval;
  byte local_1d;
  int timeLimit;
  bool force;
  char **ppcStack_18;
  int threads;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  timeLimit = 0;
  local_1d = 0;
  interval._4_4_ = -1;
  dStack_30 = 1.0;
  local_34 = 1;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  do {
    if ((int)argv_local <= local_34) {
      uVar2 = std::thread::hardware_concurrency();
      uVar5 = (ulong)uVar2;
      if (timeLimit < 1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Using all ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
        poVar4 = std::operator<<(poVar4," CPUs");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        timeLimit = uVar2;
      }
      if (uVar5 < (ulong)(long)timeLimit) {
        if ((local_1d & 1) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Capping to ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
          poVar4 = std::operator<<(poVar4,". Use -f to override.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          timeLimit = uVar2;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "Warning, forced to use more threads than CPUs, ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,timeLimit);
          poVar4 = std::operator<<(poVar4," threads, but only ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
          poVar4 = std::operator<<(poVar4," CPUs detected!");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      if (0x100 < (uint)timeLimit) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Capping to ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x100);
        poVar4 = std::operator<<(poVar4,". Recompile with higher max_threads.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        timeLimit = 0x100;
      }
      iVar1 = run_stress(timeLimit,interval._4_4_,dStack_30);
      return iVar1;
    }
    iVar1 = strcmp(ppcStack_18[local_34],"-t");
    if (iVar1 == 0) {
      if ((int)argv_local <= local_34 + 1) {
        error("Missing argument to thread count option (-t)",2);
      }
      local_34 = local_34 + 1;
      timeLimit = atoi(ppcStack_18[local_34]);
    }
    else {
      iVar1 = strcmp(ppcStack_18[local_34],"-i");
      if (iVar1 == 0) {
        if ((int)argv_local <= local_34 + 1) {
          error("Missing argument to iteration count option (-i)",2);
        }
        local_34 = local_34 + 1;
        interval._4_4_ = atoi(ppcStack_18[local_34]);
      }
      else {
        iVar1 = strcmp(ppcStack_18[local_34],"-d");
        if (iVar1 == 0) {
          if ((int)argv_local <= local_34 + 1) {
            error("Missing argument to delay option (-d)",2);
          }
          local_40 = 0.0;
          local_34 = local_34 + 1;
          local_48 = atof(ppcStack_18[local_34]);
          pdVar3 = std::max<double>(&local_40,&local_48);
          dStack_30 = *pdVar3;
        }
        else {
          iVar1 = strcmp(ppcStack_18[local_34],"-f");
          if (iVar1 == 0) {
            local_1d = 1;
          }
          else {
            iVar1 = strcmp(ppcStack_18[local_34],"--help");
            if (iVar1 == 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,*ppcStack_18);
              poVar4 = std::operator<<(poVar4," [-t threads] [-d delay] [-f]");
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(poVar4,
                                       "threads is the number of CPUs to use. Default=0. 0=All");
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(poVar4,"delay is the number of seconds between updates. ");
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(poVar4,"Decimal fractions like 0.5 are allowed. Default=1.");
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(poVar4,
                                       "Use -f to force it to use more than the number of CPUs");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              exit(1);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,"Invalid switch: ",&local_89);
            std::operator+(&local_68,&local_88,ppcStack_18[local_34]);
            message = (char *)std::__cxx11::string::c_str();
            error(message,2);
            std::__cxx11::string::~string((string *)&local_68);
            std::__cxx11::string::~string((string *)&local_88);
            std::allocator<char>::~allocator(&local_89);
          }
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int threads = 0;
    bool force = false;
    int timeLimit = -1;
    double interval = 1.0;

    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp(argv[i], "-t"))
        {
            if (i + 1 >= argc)
                error("Missing argument to thread count option (-t)");
            threads = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-i"))
        {
            if (i + 1 >= argc)
                error("Missing argument to iteration count option (-i)");
            timeLimit = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-d"))
        {
            if (i + 1 >= argc)
                error("Missing argument to delay option (-d)");
            interval = (std::max)(0.0, atof(argv[++i]));
        }
        else if (!strcmp(argv[i], "-f"))
        {
            force = true;
        }
        else if (!strcmp(argv[i], "--help"))
        {
            std::cerr << argv[0] << " [-t threads] [-d delay] [-f]" << std::endl <<
                std::endl <<
                "threads is the number of CPUs to use. Default=0. 0=All" << std::endl <<
                std::endl <<
                "delay is the number of seconds between updates. " << std::endl <<
                "Decimal fractions like 0.5 are allowed. Default=1." << std::endl <<
                std::endl <<
                "Use -f to force it to use more than the number of CPUs" << std::endl;
            exit(1);
        }
        else
        {
            error((std::string("Invalid switch: ") + argv[i]).c_str());
        }
    }

    std::size_t cpuCount = std::thread::hardware_concurrency();

    if (threads <= 0)
    {
        std::cerr << "Using all " << cpuCount << " CPUs" << std::endl;
        threads = cpuCount;
    }

    if (threads > cpuCount)
    {
        if (force)
        {
            std::cerr << "Warning, forced to use more threads"
                         " than CPUs, " << threads << " threads,"
                         " but only " << cpuCount <<
                         " CPUs detected!" << std::endl;
        }
        else
        {
            std::cerr << "Capping to " << cpuCount <<
                    ". Use -f to override." << std::endl;
            threads = cpuCount;
        }
    }

    if (threads > max_threads)
    {
        std::cerr << "Capping to " << max_threads <<
                ". Recompile with higher max_threads." << std::endl;
        threads = max_threads;
    }

    return run_stress(threads, timeLimit, interval);
}